

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reassociation.cpp
# Opt level: O2

void __thiscall
mocker::detail::ReassociationImpl::rebuild
          (ReassociationImpl *this,
          priority_queue<mocker::detail::ReassociationImpl::RankedNode,_std::vector<mocker::detail::ReassociationImpl::RankedNode,_std::allocator<mocker::detail::ReassociationImpl::RankedNode>_>,_std::less<mocker::detail::ReassociationImpl::RankedNode>_>
          *q,iterator pos)

{
  FunctionModule *pFVar1;
  RankedNode *pRVar2;
  RankedNode *pRVar3;
  undefined1 local_ec [20];
  int local_d8;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_d0;
  shared_ptr<mocker::ir::Reg> dest;
  value_type val;
  shared_ptr<mocker::ir::Addr> lhsVal;
  shared_ptr<mocker::ir::ArithBinaryInst> newInst;
  value_type rhs;
  
  local_ec._4_8_ = &this->bb->insts;
  local_ec._12_8_ = pos._M_node;
  ir::getDest((shared_ptr<mocker::ir::IRInst> *)&dest);
  pRVar3 = (q->c).
           super__Vector_base<mocker::detail::ReassociationImpl::RankedNode,_std::allocator<mocker::detail::ReassociationImpl::RankedNode>_>
           ._M_impl.super__Vector_impl_data._M_start;
  pRVar2 = (q->c).
           super__Vector_base<mocker::detail::ReassociationImpl::RankedNode,_std::allocator<mocker::detail::ReassociationImpl::RankedNode>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if ((long)pRVar2 - (long)pRVar3 == 0x20) {
    RankedNode::RankedNode(&val,pRVar3);
    if (val.positive == true) {
      std::
      make_shared<mocker::ir::Assign,std::shared_ptr<mocker::ir::Reg>&,std::shared_ptr<mocker::ir::Addr>&>
                ((shared_ptr<mocker::ir::Reg> *)&newInst,(shared_ptr<mocker::ir::Addr> *)&dest);
      rhs._0_8_ = newInst.
                  super___shared_ptr<mocker::ir::ArithBinaryInst,_(__gnu_cxx::_Lock_policy)2>._M_ptr
      ;
      rhs.value.super___shared_ptr<mocker::ir::Addr,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (element_type *)
           newInst.super___shared_ptr<mocker::ir::ArithBinaryInst,_(__gnu_cxx::_Lock_policy)2>.
           _M_refcount._M_pi;
      newInst.super___shared_ptr<mocker::ir::ArithBinaryInst,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (element_type *)0x0;
      newInst.super___shared_ptr<mocker::ir::ArithBinaryInst,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      std::__cxx11::
      list<std::shared_ptr<mocker::ir::IRInst>,std::allocator<std::shared_ptr<mocker::ir::IRInst>>>
      ::emplace<std::shared_ptr<mocker::ir::IRInst>>
                ((list<std::shared_ptr<mocker::ir::IRInst>,std::allocator<std::shared_ptr<mocker::ir::IRInst>>>
                  *)local_ec._4_8_,(const_iterator)local_ec._12_8_,
                 (shared_ptr<mocker::ir::IRInst> *)&rhs);
    }
    else {
      lhsVal.super___shared_ptr<mocker::ir::Addr,_(__gnu_cxx::_Lock_policy)2>._M_ptr._0_4_ = 0;
      std::
      make_shared<mocker::ir::ArithUnaryInst,std::shared_ptr<mocker::ir::Reg>&,mocker::ir::ArithUnaryInst::OpType,std::shared_ptr<mocker::ir::Addr>&>
                ((shared_ptr<mocker::ir::Reg> *)&newInst,(OpType *)&dest,&lhsVal);
      rhs._0_8_ = newInst.
                  super___shared_ptr<mocker::ir::ArithBinaryInst,_(__gnu_cxx::_Lock_policy)2>._M_ptr
      ;
      rhs.value.super___shared_ptr<mocker::ir::Addr,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (element_type *)
           newInst.super___shared_ptr<mocker::ir::ArithBinaryInst,_(__gnu_cxx::_Lock_policy)2>.
           _M_refcount._M_pi;
      newInst.super___shared_ptr<mocker::ir::ArithBinaryInst,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (element_type *)0x0;
      newInst.super___shared_ptr<mocker::ir::ArithBinaryInst,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      std::__cxx11::
      list<std::shared_ptr<mocker::ir::IRInst>,std::allocator<std::shared_ptr<mocker::ir::IRInst>>>
      ::emplace<std::shared_ptr<mocker::ir::IRInst>>
                ((list<std::shared_ptr<mocker::ir::IRInst>,std::allocator<std::shared_ptr<mocker::ir::IRInst>>>
                  *)local_ec._4_8_,(const_iterator)local_ec._12_8_,
                 (shared_ptr<mocker::ir::IRInst> *)&rhs);
    }
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&rhs.value);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              (&newInst.super___shared_ptr<mocker::ir::ArithBinaryInst,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount);
LAB_001650c1:
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              (&val.value.super___shared_ptr<mocker::ir::Addr,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount);
  }
  else {
    while (pRVar3 != pRVar2) {
      ir::getDest((shared_ptr<mocker::ir::IRInst> *)&val);
      std::__shared_ptr<mocker::ir::Reg,_(__gnu_cxx::_Lock_policy)2>::operator=
                (&dest.super___shared_ptr<mocker::ir::Reg,_(__gnu_cxx::_Lock_policy)2>,
                 (__shared_ptr<mocker::ir::Reg,_(__gnu_cxx::_Lock_policy)2> *)&val);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&val.value);
      RankedNode::RankedNode
                (&val,(q->c).
                      super__Vector_base<mocker::detail::ReassociationImpl::RankedNode,_std::allocator<mocker::detail::ReassociationImpl::RankedNode>_>
                      ._M_impl.super__Vector_impl_data._M_start);
      std::
      priority_queue<mocker::detail::ReassociationImpl::RankedNode,_std::vector<mocker::detail::ReassociationImpl::RankedNode,_std::allocator<mocker::detail::ReassociationImpl::RankedNode>_>,_std::less<mocker::detail::ReassociationImpl::RankedNode>_>
      ::pop(q);
      pRVar3 = (q->c).
               super__Vector_base<mocker::detail::ReassociationImpl::RankedNode,_std::allocator<mocker::detail::ReassociationImpl::RankedNode>_>
               ._M_impl.super__Vector_impl_data._M_start;
      if (pRVar3 == (q->c).
                    super__Vector_base<mocker::detail::ReassociationImpl::RankedNode,_std::allocator<mocker::detail::ReassociationImpl::RankedNode>_>
                    ._M_impl.super__Vector_impl_data._M_finish) goto LAB_001650c1;
      RankedNode::RankedNode(&rhs,pRVar3);
      std::
      priority_queue<mocker::detail::ReassociationImpl::RankedNode,_std::vector<mocker::detail::ReassociationImpl::RankedNode,_std::allocator<mocker::detail::ReassociationImpl::RankedNode>_>,_std::less<mocker::detail::ReassociationImpl::RankedNode>_>
      ::pop(q);
      std::dynamic_pointer_cast<mocker::ir::IntLiteral,mocker::ir::Addr>
                ((shared_ptr<mocker::ir::Addr> *)
                 &newInst.
                  super___shared_ptr<mocker::ir::ArithBinaryInst,_(__gnu_cxx::_Lock_policy)2>);
      if (newInst.super___shared_ptr<mocker::ir::ArithBinaryInst,_(__gnu_cxx::_Lock_policy)2>._M_ptr
          != (element_type *)0x0) {
        std::dynamic_pointer_cast<mocker::ir::IntLiteral,mocker::ir::Addr>(&lhsVal);
        if (CONCAT44(lhsVal.super___shared_ptr<mocker::ir::Addr,_(__gnu_cxx::_Lock_policy)2>._M_ptr.
                     _4_4_,lhsVal.super___shared_ptr<mocker::ir::Addr,_(__gnu_cxx::_Lock_policy)2>.
                           _M_ptr._0_4_) != 0) {
          __assert_fail("!ir::dyc<ir::IntLiteral>(lhs.value) || !ir::dyc<ir::IntLiteral>(rhs.value)"
                        ,
                        "/workspace/llm4binary/github/license_c_cmakelists/Engineev[P]mocker/compiler/optim/reassociation.cpp"
                        ,0x132,
                        "void mocker::detail::ReassociationImpl::rebuild(std::priority_queue<detail::ReassociationImpl::RankedNode> &, std::list<std::shared_ptr<ir::IRInst>>::iterator)"
                       );
        }
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                  (&lhsVal.super___shared_ptr<mocker::ir::Addr,_(__gnu_cxx::_Lock_policy)2>.
                    _M_refcount);
      }
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                (&newInst.
                  super___shared_ptr<mocker::ir::ArithBinaryInst,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount);
      if ((q->c).
          super__Vector_base<mocker::detail::ReassociationImpl::RankedNode,_std::allocator<mocker::detail::ReassociationImpl::RankedNode>_>
          ._M_impl.super__Vector_impl_data._M_start !=
          (q->c).
          super__Vector_base<mocker::detail::ReassociationImpl::RankedNode,_std::allocator<mocker::detail::ReassociationImpl::RankedNode>_>
          ._M_impl.super__Vector_impl_data._M_finish) {
        pFVar1 = this->func;
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)
                   &newInst.
                    super___shared_ptr<mocker::ir::ArithBinaryInst,_(__gnu_cxx::_Lock_policy)2>,"",
                   (allocator<char> *)&local_d8);
        ir::FunctionModule::makeTempLocalReg((FunctionModule *)&lhsVal,&pFVar1->identifier);
        std::__shared_ptr<mocker::ir::Reg,_(__gnu_cxx::_Lock_policy)2>::operator=
                  (&dest.super___shared_ptr<mocker::ir::Reg,_(__gnu_cxx::_Lock_policy)2>,
                   (__shared_ptr<mocker::ir::Reg,_(__gnu_cxx::_Lock_policy)2> *)&lhsVal);
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                  (&lhsVal.super___shared_ptr<mocker::ir::Addr,_(__gnu_cxx::_Lock_policy)2>.
                    _M_refcount);
        std::__cxx11::string::~string
                  ((string *)
                   &newInst.
                    super___shared_ptr<mocker::ir::ArithBinaryInst,_(__gnu_cxx::_Lock_policy)2>);
      }
      if (val.positive == false) {
        std::swap<mocker::detail::ReassociationImpl::RankedNode>(&val,&rhs);
      }
      std::__shared_ptr<mocker::ir::Addr,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
                ((__shared_ptr<mocker::ir::Addr,_(__gnu_cxx::_Lock_policy)2> *)&lhsVal,
                 &val.value.super___shared_ptr<mocker::ir::Addr,_(__gnu_cxx::_Lock_policy)2>);
      if (val.positive == false) {
        pFVar1 = this->func;
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)
                   &newInst.
                    super___shared_ptr<mocker::ir::ArithBinaryInst,_(__gnu_cxx::_Lock_policy)2>,"",
                   (allocator<char> *)local_ec);
        ir::FunctionModule::makeTempLocalReg((FunctionModule *)&local_d8,&pFVar1->identifier);
        std::__shared_ptr<mocker::ir::Addr,(__gnu_cxx::_Lock_policy)2>::operator=
                  ((__shared_ptr<mocker::ir::Addr,(__gnu_cxx::_Lock_policy)2> *)&lhsVal,
                   (__shared_ptr<mocker::ir::Reg,_(__gnu_cxx::_Lock_policy)2> *)&local_d8);
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_d0);
        std::__cxx11::string::~string
                  ((string *)
                   &newInst.
                    super___shared_ptr<mocker::ir::ArithBinaryInst,_(__gnu_cxx::_Lock_policy)2>);
        ir::dycLocalReg((shared_ptr<mocker::ir::Addr> *)&local_d8);
        local_ec._0_4_ = 0;
        std::
        make_shared<mocker::ir::ArithUnaryInst,std::shared_ptr<mocker::ir::Reg>,mocker::ir::ArithUnaryInst::OpType,std::shared_ptr<mocker::ir::Addr>&>
                  ((shared_ptr<mocker::ir::Reg> *)
                   &newInst.
                    super___shared_ptr<mocker::ir::ArithBinaryInst,_(__gnu_cxx::_Lock_policy)2>,
                   (OpType *)&local_d8,(shared_ptr<mocker::ir::Addr> *)local_ec);
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_d0);
        std::__shared_ptr<mocker::ir::IRInst,(__gnu_cxx::_Lock_policy)2>::
        __shared_ptr<mocker::ir::ArithUnaryInst,void>
                  ((__shared_ptr<mocker::ir::IRInst,(__gnu_cxx::_Lock_policy)2> *)&local_d8,
                   (__shared_ptr<mocker::ir::ArithUnaryInst,_(__gnu_cxx::_Lock_policy)2> *)
                   &newInst.
                    super___shared_ptr<mocker::ir::ArithBinaryInst,_(__gnu_cxx::_Lock_policy)2>);
        std::__cxx11::
        list<std::shared_ptr<mocker::ir::IRInst>,std::allocator<std::shared_ptr<mocker::ir::IRInst>>>
        ::emplace<std::shared_ptr<mocker::ir::IRInst>>
                  ((list<std::shared_ptr<mocker::ir::IRInst>,std::allocator<std::shared_ptr<mocker::ir::IRInst>>>
                    *)local_ec._4_8_,(const_iterator)local_ec._12_8_,
                   (shared_ptr<mocker::ir::IRInst> *)&local_d8);
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_d0);
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                  (&newInst.
                    super___shared_ptr<mocker::ir::ArithBinaryInst,_(__gnu_cxx::_Lock_policy)2>.
                    _M_refcount);
      }
      local_d8 = 6 - (uint)rhs.positive;
      std::
      make_shared<mocker::ir::ArithBinaryInst,std::shared_ptr<mocker::ir::Reg>&,mocker::ir::ArithBinaryInst::OpType,std::shared_ptr<mocker::ir::Addr>&,std::shared_ptr<mocker::ir::Addr>&>
                ((shared_ptr<mocker::ir::Reg> *)
                 &newInst.
                  super___shared_ptr<mocker::ir::ArithBinaryInst,_(__gnu_cxx::_Lock_policy)2>,
                 (OpType *)&dest,(shared_ptr<mocker::ir::Addr> *)&local_d8,&lhsVal);
      std::__shared_ptr<mocker::ir::IRInst,(__gnu_cxx::_Lock_policy)2>::
      __shared_ptr<mocker::ir::ArithBinaryInst,void>
                ((__shared_ptr<mocker::ir::IRInst,(__gnu_cxx::_Lock_policy)2> *)&local_d8,
                 &newInst.
                  super___shared_ptr<mocker::ir::ArithBinaryInst,_(__gnu_cxx::_Lock_policy)2>);
      std::__cxx11::
      list<std::shared_ptr<mocker::ir::IRInst>,std::allocator<std::shared_ptr<mocker::ir::IRInst>>>
      ::emplace<std::shared_ptr<mocker::ir::IRInst>>
                ((list<std::shared_ptr<mocker::ir::IRInst>,std::allocator<std::shared_ptr<mocker::ir::IRInst>>>
                  *)local_ec._4_8_,(const_iterator)local_ec._12_8_,
                 (shared_ptr<mocker::ir::IRInst> *)&local_d8);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_d0);
      if ((q->c).
          super__Vector_base<mocker::detail::ReassociationImpl::RankedNode,_std::allocator<mocker::detail::ReassociationImpl::RankedNode>_>
          ._M_impl.super__Vector_impl_data._M_start !=
          (q->c).
          super__Vector_base<mocker::detail::ReassociationImpl::RankedNode,_std::allocator<mocker::detail::ReassociationImpl::RankedNode>_>
          ._M_impl.super__Vector_impl_data._M_finish) {
        local_ec[0] = 1;
        local_d8 = rhs.rank + val.rank;
        std::
        priority_queue<mocker::detail::ReassociationImpl::RankedNode,std::vector<mocker::detail::ReassociationImpl::RankedNode,std::allocator<mocker::detail::ReassociationImpl::RankedNode>>,std::less<mocker::detail::ReassociationImpl::RankedNode>>
        ::emplace<bool,std::shared_ptr<mocker::ir::Reg>&,int>
                  ((priority_queue<mocker::detail::ReassociationImpl::RankedNode,std::vector<mocker::detail::ReassociationImpl::RankedNode,std::allocator<mocker::detail::ReassociationImpl::RankedNode>>,std::less<mocker::detail::ReassociationImpl::RankedNode>>
                    *)q,(bool *)local_ec,&dest,&local_d8);
      }
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                (&newInst.
                  super___shared_ptr<mocker::ir::ArithBinaryInst,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                (&lhsVal.super___shared_ptr<mocker::ir::Addr,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                (&rhs.value.super___shared_ptr<mocker::ir::Addr,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                (&val.value.super___shared_ptr<mocker::ir::Addr,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount);
      pRVar2 = (q->c).
               super__Vector_base<mocker::detail::ReassociationImpl::RankedNode,_std::allocator<mocker::detail::ReassociationImpl::RankedNode>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      pRVar3 = (q->c).
               super__Vector_base<mocker::detail::ReassociationImpl::RankedNode,_std::allocator<mocker::detail::ReassociationImpl::RankedNode>_>
               ._M_impl.super__Vector_impl_data._M_start;
    }
  }
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&dest.super___shared_ptr<mocker::ir::Reg,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  return;
}

Assistant:

void detail::ReassociationImpl::rebuild(
    std::priority_queue<detail::ReassociationImpl::RankedNode> &q,
    std::list<std::shared_ptr<ir::IRInst>>::iterator pos) {
  auto &insts = bb.getMutableInsts();
  auto dest = ir::getDest(*pos);

  //  std::cerr << "rebuilding: " <<  ir::fmtAddr(dest) << std::endl;

  if (q.size() == 1) {
    auto val = q.top();
    if (val.positive)
      insts.insert(pos, std::make_shared<ir::Assign>(dest, val.value));
    else
      insts.insert(pos, std::make_shared<ir::ArithUnaryInst>(
                            dest, ir::ArithUnaryInst::Neg, val.value));
    return;
  }

  while (!q.empty()) {
    dest = ir::getDest(*pos);
    auto lhs = q.top();
    q.pop();
    if (q.empty())
      return;
    auto rhs = q.top();
    q.pop();

    assert(!ir::dyc<ir::IntLiteral>(lhs.value) ||
           !ir::dyc<ir::IntLiteral>(rhs.value));

    if (!q.empty())
      dest = func.makeTempLocalReg();

    // emit
    if (!lhs.positive)
      std::swap(lhs, rhs);
    auto lhsVal = lhs.value;
    if (!lhs.positive) {
      lhsVal = func.makeTempLocalReg();
      auto newInst = std::make_shared<ir::ArithUnaryInst>(
          ir::dycLocalReg(lhsVal), ir::ArithUnaryInst::Neg, lhs.value);
      insts.insert(pos, newInst);
    }
    auto newInst = std::make_shared<ir::ArithBinaryInst>(
        dest,
        rhs.positive ? ir::ArithBinaryInst::Add : ir::ArithBinaryInst::Sub,
        lhsVal, rhs.value);
    insts.insert(pos, newInst);
    if (!q.empty()) {
      q.emplace(true, dest, lhs.rank + rhs.rank);
    }
  }
}